

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsignalspy.cpp
# Opt level: O0

void __thiscall QSignalSpy::QSignalSpy(QSignalSpy *this,ObjectSignal os)

{
  QMetaMethod member;
  byte bVar1;
  uint uVar2;
  int iVar3;
  pointer pQVar4;
  RestrictedBool RVar5;
  long in_RDI;
  long in_FS_OFFSET;
  long in_stack_00000008;
  QMetaObject *in_stack_00000018;
  int slotIndex;
  int signalIndex;
  __single_object i;
  QObject *in_stack_ffffffffffffff18;
  unique_ptr<QSignalSpyPrivate,_std::default_delete<QSignalSpyPrivate>_> *function;
  undefined4 in_stack_ffffffffffffff20;
  int in_stack_ffffffffffffff24;
  char *in_stack_ffffffffffffff28;
  undefined7 in_stack_ffffffffffffff30;
  QSignalSpy **in_stack_ffffffffffffff38;
  char local_50 [32];
  QObject local_30 [16];
  undefined1 *local_20;
  Data DVar6;
  
  DVar6.d = *(uint **)(in_FS_OFFSET + 0x28);
  QList<QList<QVariant>_>::QList((QList<QList<QVariant>_> *)0x136e23);
  std::unique_ptr<QSignalSpyPrivate,std::default_delete<QSignalSpyPrivate>>::
  unique_ptr<std::default_delete<QSignalSpyPrivate>,void>
            ((unique_ptr<QSignalSpyPrivate,_std::default_delete<QSignalSpyPrivate>_> *)
             CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20));
  QMetaMethod::methodSignature();
  if (in_stack_00000008 == 0) {
    memset((void *)(in_RDI + 0x38),0,0x18);
    QList<int>::QList((QList<int> *)0x136eb7);
  }
  else {
    member.data.d = DVar6.d;
    member.mobj = in_stack_00000018;
    makeArgs(member);
  }
  QTestEventLoop::QTestEventLoop
            ((QTestEventLoop *)CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20),
             in_stack_ffffffffffffff18);
  *(undefined1 *)(in_RDI + 0x70) = 0;
  QMutex::QMutex((QMutex *)0x136ee7);
  if (in_stack_00000008 != 0) {
    local_20 = &DAT_aaaaaaaaaaaaaaaa;
    std::make_unique<QSignalSpyPrivate,QSignalSpy*>(in_stack_ffffffffffffff38);
    uVar2 = QMetaMethod::methodIndex();
    iVar3 = QMetaObject::methodCount();
    pQVar4 = std::unique_ptr<QSignalSpyPrivate,_std::default_delete<QSignalSpyPrivate>_>::get
                       ((unique_ptr<QSignalSpyPrivate,_std::default_delete<QSignalSpyPrivate>_> *)
                        CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20));
    function = (unique_ptr<QSignalSpyPrivate,_std::default_delete<QSignalSpyPrivate>_> *)0x0;
    QMetaObject::connect
              (local_30,(int)in_stack_00000008,(QObject *)(ulong)uVar2,(int)pQVar4,iVar3,(int *)0x1)
    ;
    RVar5 = QMetaObject::Connection::operator_cast_to__
                      ((Connection *)CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20));
    bVar1 = RVar5 != 0xffffffffffffffff ^ 0xff;
    QMetaObject::Connection::~Connection((Connection *)local_30);
    if ((bVar1 & 1) == 0) {
      std::unique_ptr<QSignalSpyPrivate,_std::default_delete<QSignalSpyPrivate>_>::operator=
                ((unique_ptr<QSignalSpyPrivate,_std::default_delete<QSignalSpyPrivate>_> *)
                 CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20),function);
    }
    else {
      QMessageLogger::QMessageLogger
                ((QMessageLogger *)CONCAT17(bVar1,in_stack_ffffffffffffff30),
                 in_stack_ffffffffffffff28,in_stack_ffffffffffffff24,(char *)function);
      QMessageLogger::warning
                (local_50,"QSignalSpy: QMetaObject::connect returned false. Unable to connect.");
    }
    std::unique_ptr<QSignalSpyPrivate,_std::default_delete<QSignalSpyPrivate>_>::~unique_ptr
              ((unique_ptr<QSignalSpyPrivate,_std::default_delete<QSignalSpyPrivate>_> *)
               CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20));
  }
  if (*(uint **)(in_FS_OFFSET + 0x28) != DVar6.d) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

QSignalSpy::QSignalSpy(ObjectSignal os)
    : sig(os.sig.methodSignature()),
      args(os.obj ? makeArgs(os.sig) : QList<int>{})
{
    if (!os.obj)
        return;

    auto i = std::make_unique<QSignalSpyPrivate>(this);

    const auto signalIndex = os.sig.methodIndex();
    const auto slotIndex = QObject::staticMetaObject.methodCount();
    if (!QMetaObject::connect(os.obj, signalIndex,
                              i.get(), slotIndex, Qt::DirectConnection)) {
        qWarning("QSignalSpy: QMetaObject::connect returned false. Unable to connect.");
        return;
    }

    d_ptr = std::move(i);
}